

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O1

JSON_Status json_object_add(JSON_Object *object,char *name,JSON_Value *value)

{
  size_t sVar1;
  uint in_EAX;
  JSON_Status JVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  unsigned_long hash;
  parson_bool_t found;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  JVar2 = -1;
  if (value != (JSON_Value *)0x0 && (name != (char *)0x0 && object != (JSON_Object *)0x0)) {
    sVar3 = strlen(name);
    if (sVar3 == 0) {
      hash = 0x1505;
    }
    else {
      hash = 0x1505;
      sVar5 = 0;
      do {
        if ((ulong)(byte)name[sVar5] == 0) break;
        hash = hash * 0x21 + (ulong)(byte)name[sVar5];
        sVar5 = sVar5 + 1;
      } while (sVar3 != sVar5);
    }
    uStack_38 = uStack_38 & 0xffffffff;
    sVar4 = json_object_get_cell_ix(object,name,sVar3,hash,(parson_bool_t *)((long)&uStack_38 + 4));
    if (uStack_38._4_4_ == 0) {
      if (object->item_capacity <= object->count) {
        JVar2 = json_object_grow_and_rehash(object);
        if (JVar2 != 0) {
          return -1;
        }
        sVar3 = strlen(name);
        sVar4 = json_object_get_cell_ix
                          (object,name,sVar3,hash,(parson_bool_t *)((long)&uStack_38 + 4));
      }
      sVar1 = object->count;
      object->names[sVar1] = name;
      object->cells[sVar4] = sVar1;
      sVar1 = object->count;
      object->values[sVar1] = value;
      object->cell_ixs[sVar1] = sVar4;
      object->hashes[object->count] = hash;
      object->count = object->count + 1;
      value->parent = object->wrapping_value;
      JVar2 = 0;
    }
  }
  return JVar2;
}

Assistant:

static JSON_Status json_object_add(JSON_Object *object, char *name, JSON_Value *value) {
    unsigned long hash = 0;
    parson_bool_t found = PARSON_FALSE;
    size_t cell_ix = 0;
    JSON_Status res = JSONFailure;

    if (!object || !name || !value) {
        return JSONFailure;
    }

    hash = hash_string(name, strlen(name));
    found = PARSON_FALSE;
    cell_ix = json_object_get_cell_ix(object, name, strlen(name), hash, &found);
    if (found) {
        return JSONFailure;
    }

    if (object->count >= object->item_capacity) {
        res = json_object_grow_and_rehash(object);
        if (res != JSONSuccess) {
            return JSONFailure;
        }
        cell_ix = json_object_get_cell_ix(object, name, strlen(name), hash, &found);
    }

    object->names[object->count] = name;
    object->cells[cell_ix] = object->count;
    object->values[object->count] = value;
    object->cell_ixs[object->count] = cell_ix;
    object->hashes[object->count] = hash;
    object->count++;
    value->parent = json_object_get_wrapping_value(object);

    return JSONSuccess;
}